

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O0

void xmlSchematronParseTestReportMsg(xmlSchematronParserCtxtPtr ctxt,xmlNodePtr con)

{
  int iVar1;
  xmlChar *str;
  xmlXPathCompExprPtr comp_00;
  xmlChar *select;
  xmlXPathCompExprPtr comp;
  xmlNodePtr child;
  xmlNodePtr con_local;
  xmlSchematronParserCtxtPtr ctxt_local;
  
  for (comp = (xmlXPathCompExprPtr)con->children; comp != (xmlXPathCompExprPtr)0x0;
      comp = (xmlXPathCompExprPtr)comp[1].steps) {
    if (((((*(int *)&comp->steps != 3) && (*(int *)&comp->steps != 4)) &&
         ((comp == (xmlXPathCompExprPtr)0x0 ||
          ((((*(int *)&comp->steps != 1 || (comp[1].dict == (xmlDictPtr)0x0)) ||
            (iVar1 = xmlStrEqual(*(xmlChar **)&comp->last,"name"), iVar1 == 0)) ||
           ((iVar1 = xmlStrEqual((xmlChar *)(comp[1].dict)->size,xmlSchematronNs), iVar1 == 0 &&
            (iVar1 = xmlStrEqual((xmlChar *)(comp[1].dict)->size,xmlOldSchematronNs), iVar1 == 0))))
          )))) && (comp != (xmlXPathCompExprPtr)0x0)) &&
       (((*(int *)&comp->steps == 1 && (comp[1].dict != (xmlDictPtr)0x0)) &&
        ((iVar1 = xmlStrEqual(*(xmlChar **)&comp->last,(xmlChar *)"value-of"), iVar1 != 0 &&
         ((iVar1 = xmlStrEqual((xmlChar *)(comp[1].dict)->size,xmlSchematronNs), iVar1 != 0 ||
          (iVar1 = xmlStrEqual((xmlChar *)(comp[1].dict)->size,xmlOldSchematronNs), iVar1 != 0))))))
       )) {
      str = xmlGetNoNsProp((xmlNode *)comp,"select");
      if (str == (xmlChar *)0x0) {
        xmlSchematronPErr(ctxt,(xmlNodePtr)comp,0x71d,"value-of has no select attribute",
                          (xmlChar *)0x0,(xmlChar *)0x0);
      }
      else {
        comp_00 = xmlXPathCtxtCompile(ctxt->xctxt,str);
        if (comp_00 == (xmlXPathCompExprPtr)0x0) {
          xmlSchematronPErr(ctxt,(xmlNodePtr)comp,0x71d,"Failed to compile select expression %s",str
                            ,(xmlChar *)0x0);
        }
        xmlXPathFreeCompExpr(comp_00);
      }
      (*xmlFree)(str);
    }
  }
  return;
}

Assistant:

static void
xmlSchematronParseTestReportMsg(xmlSchematronParserCtxtPtr ctxt, xmlNodePtr con)
{
    xmlNodePtr child;
    xmlXPathCompExprPtr comp;

    child = con->children;
    while (child != NULL) {
        if ((child->type == XML_TEXT_NODE) ||
            (child->type == XML_CDATA_SECTION_NODE))
            /* Do Nothing */
            {}
        else if (IS_SCHEMATRON(child, "name")) {
            /* Do Nothing */
        } else if (IS_SCHEMATRON(child, "value-of")) {
            xmlChar *select;

            select = xmlGetNoNsProp(child, BAD_CAST "select");

            if (select == NULL) {
                xmlSchematronPErr(ctxt, child,
                                  XML_SCHEMAV_ATTRINVALID,
                                  "value-of has no select attribute",
                                  NULL, NULL);
            } else {
                /*
                 * try first to compile the test expression
                 */
                comp = xmlXPathCtxtCompile(ctxt->xctxt, select);
                if (comp == NULL) {
                    xmlSchematronPErr(ctxt, child,
                                      XML_SCHEMAV_ATTRINVALID,
                                      "Failed to compile select expression %s",
                                      select, NULL);
                }
                xmlXPathFreeCompExpr(comp);
            }
            xmlFree(select);
        }
        child = child->next;
    }
}